

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

void Js::JavascriptBigInt::Decrement(JavascriptBigInt *pbi)

{
  bool bVar1;
  unsigned_long **ppuVar2;
  JavascriptBigInt *result;
  JavascriptBigInt *pbi_local;
  
  if ((pbi->m_isNegative & 1U) == 0) {
    bVar1 = IsZero(pbi);
    if (bVar1) {
      ppuVar2 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)&pbi->m_digits);
      **ppuVar2 = 1;
      pbi->m_isNegative = true;
    }
    else {
      AbsoluteDecrement(pbi);
    }
  }
  else {
    AbsoluteIncrement(pbi);
  }
  return;
}

Assistant:

void JavascriptBigInt::Decrement(JavascriptBigInt * pbi)
    {
        if (pbi->m_isNegative)
        {
            return JavascriptBigInt::AbsoluteIncrement(pbi);
        }
        if (JavascriptBigInt::IsZero(pbi)) // return -1n for 0n
        {
            JavascriptBigInt* result = pbi;
            result->m_digits[0] = 1;
            result->m_isNegative = true;
            return;
        }
        return JavascriptBigInt::AbsoluteDecrement(pbi);
    }